

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_>_>
::reject(AdapterPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_>_>
         *this,Exception *exception)

{
  Exception *exception_00;
  ExceptionOr<kj::Own<capnp::ClientHook>_> local_188;
  Exception *local_18;
  Exception *exception_local;
  AdapterPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_>_>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = exception;
    exception_local = (Exception *)this;
    exception_00 = mv<kj::Exception>(exception);
    ExceptionOr<kj::Own<capnp::ClientHook>_>::ExceptionOr(&local_188,false,exception_00);
    ExceptionOr<kj::Own<capnp::ClientHook>_>::operator=(&this->result,&local_188);
    ExceptionOr<kj::Own<capnp::ClientHook>_>::~ExceptionOr(&local_188);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }